

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall wasm::TypeBuilder::Impl::Impl(Impl *this,size_t n)

{
  size_t __n;
  allocator<wasm::TypeBuilder::Impl::Entry> local_19;
  size_t local_18;
  size_t n_local;
  Impl *this_local;
  
  local_18 = n;
  n_local = (size_t)this;
  anon_unknown_0::Store<wasm::(anonymous_namespace)::TypeInfo>::Store(&this->typeStore);
  std::
  vector<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::allocator<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>_>
  ::vector(&this->recGroups);
  __n = local_18;
  std::allocator<wasm::TypeBuilder::Impl::Entry>::allocator(&local_19);
  std::vector<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>::
  vector(&this->entries,__n,&local_19);
  std::allocator<wasm::TypeBuilder::Impl::Entry>::~allocator(&local_19);
  return;
}

Assistant:

Impl(size_t n) : entries(n) {}